

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# row_group.cpp
# Opt level: O2

void __thiscall duckdb::VersionDeleteState::Flush(VersionDeleteState *this)

{
  DataTable *table;
  idx_t count;
  DuckTransaction *this_00;
  RowVersionManager *info;
  
  if (this->count != 0) {
    count = RowGroup::DeleteRows
                      (this->info,this->current_chunk,(this->transaction).transaction_id,this->rows,
                       this->count);
    this->delete_count = this->delete_count + count;
    if ((count != 0) && ((this->transaction).transaction.ptr != (DuckTransaction *)0x0)) {
      this_00 = optional_ptr<duckdb::DuckTransaction,_true>::operator->
                          (&(this->transaction).transaction);
      table = this->table;
      info = RowGroup::GetOrCreateVersionInfo(this->info);
      DuckTransaction::PushDelete
                (this_00,table,info,this->current_chunk,this->rows,count,
                 this->chunk_row + this->base_row);
    }
    this->count = 0;
  }
  return;
}

Assistant:

void VersionDeleteState::Flush() {
	if (count == 0) {
		return;
	}
	// it is possible for delete statements to delete the same tuple multiple times when combined with a USING clause
	// in the current_info->Delete, we check which tuples are actually deleted (excluding duplicate deletions)
	// this is returned in the actual_delete_count
	auto actual_delete_count = info.DeleteRows(current_chunk, transaction.transaction_id, rows, count);
	delete_count += actual_delete_count;
	if (transaction.transaction && actual_delete_count > 0) {
		// now push the delete into the undo buffer, but only if any deletes were actually performed
		transaction.transaction->PushDelete(table, info.GetOrCreateVersionInfo(), current_chunk, rows,
		                                    actual_delete_count, base_row + chunk_row);
	}
	count = 0;
}